

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_read_pcm_frames_le(drwav *pWav,drwav_uint64 framesToRead,void *pBufferOut)

{
  uint uVar1;
  drwav_uint64 dVar2;
  size_t sVar3;
  
  if (framesToRead != 0 && pWav != (drwav *)0x0) {
    if ((pWav->translatedFormatTag == 2) || (pWav->translatedFormatTag == 0x11)) {
      return 0;
    }
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar1 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
    }
    else {
      uVar1 = (uint)(pWav->fmt).blockAlign;
    }
    if (uVar1 != 0) {
      sVar3 = framesToRead * uVar1;
      if (sVar3 == 0) {
        dVar2 = 0;
      }
      else {
        sVar3 = drwav_read_raw(pWav,sVar3,pBufferOut);
        dVar2 = sVar3 / uVar1;
      }
      return dVar2;
    }
  }
  return 0;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_le(drwav* pWav, drwav_uint64 framesToRead, void* pBufferOut)
{
    drwav_uint32 bytesPerFrame;
    drwav_uint64 bytesToRead;   /* Intentionally uint64 instead of size_t so we can do a check that we're not reading too much on 32-bit builds. */

    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    /* Cannot use this function for compressed formats. */
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        return 0;
    }

    bytesPerFrame = drwav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    bytesToRead = framesToRead * bytesPerFrame;
    if (bytesToRead > DRWAV_SIZE_MAX) {
        bytesToRead = (DRWAV_SIZE_MAX / bytesPerFrame) * bytesPerFrame; /* Round the number of bytes to read to a clean frame boundary. */
    }

    /*
    Doing an explicit check here just to make it clear that we don't want to be attempt to read anything if there's no bytes to read. There
    *could* be a time where it evaluates to 0 due to overflowing.
    */
    if (bytesToRead == 0) {
        return 0;
    }

    return drwav_read_raw(pWav, (size_t)bytesToRead, pBufferOut) / bytesPerFrame;
}